

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  char *pcVar2;
  xmlDocPtr pxVar3;
  char cVar4;
  _xmlNode *p_Var5;
  _xmlDtd *data;
  _xmlDtd *p_Var6;
  xmlDocPtr pxVar7;
  _xmlDtd *p_Var8;
  _xmlDtd **pp_Var9;
  xmlDocPtr pxVar10;
  xmlDocPtr cur_00;
  xmlDocPtr local_48;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  iVar1 = ctxt->format;
  buf = ctxt->buf;
  local_48 = (xmlDocPtr)0x0;
  pxVar3 = (xmlDocPtr)cur;
  cur_00 = (xmlDocPtr)cur->parent;
LAB_001684c5:
  pxVar7 = cur_00;
  cur_00 = pxVar3;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if ((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (((xmlDocPtr)cur_00->parent != pxVar7) && (cur_00->children != (_xmlNode *)0x0)) {
      xmlNodeDumpOutputInternal(ctxt,(xmlNodePtr)cur_00);
      break;
    }
    xmlOutputBufferWrite(buf,1,"<");
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar2 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar2 != (char *)0x0)) {
      xmlOutputBufferWriteString(buf,pcVar2);
      xmlOutputBufferWrite(buf,1,":");
    }
    xmlOutputBufferWriteString(buf,cur_00->name);
    if (cur_00->oldNs != (xmlNsPtr)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,cur_00->oldNs);
    }
    pp_Var9 = &cur_00->extSubset;
    while (p_Var8 = *pp_Var9, p_Var8 != (_xmlDtd *)0x0) {
      xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var8);
      pp_Var9 = (_xmlDtd **)&p_Var8->next;
    }
    p_Var5 = cur_00->children;
    if (p_Var5 != (_xmlNode *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,1);
      }
      else if (ctxt->format == 1) {
        for (; p_Var5 != (_xmlNode *)0x0; p_Var5 = p_Var5->next) {
          if (p_Var5->type - XML_TEXT_NODE < 3) {
            ctxt->format = 0;
            local_48 = cur_00;
            break;
          }
        }
      }
      xmlOutputBufferWrite(buf,1,">");
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(buf,1,"\n");
      }
      if (-1 < ctxt->level) {
        ctxt->level = ctxt->level + 1;
      }
      pxVar3 = (xmlDocPtr)cur_00->children;
      goto LAB_001684c5;
    }
    if ((ctxt->options & 4) == 0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(buf,2,"/>");
    }
    else {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,1);
      }
      xmlOutputBufferWrite(buf,3,"></");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar2 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar2 != (char *)0x0)) {
        xmlOutputBufferWriteString(buf,pcVar2);
        xmlOutputBufferWrite(buf,1,":");
      }
      xmlOutputBufferWriteString(buf,cur_00->name);
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(buf,1,">");
    }
    break;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var8 = cur_00->intSubset;
    if (p_Var8 != (_xmlDtd *)0x0) {
      if ((xmlChar *)cur_00->name == "textnoenc") {
        xmlOutputBufferWriteString(buf,(char *)p_Var8);
      }
      else if (ctxt->escape == (xmlCharEncodingOutputFunc)0x0) {
        xmlSaveWriteText(ctxt,(xmlChar *)p_Var8,0);
      }
      else {
        xmlOutputBufferWriteEscape(buf,(xmlChar *)p_Var8,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    p_Var8 = cur_00->intSubset;
    if ((p_Var8 != (_xmlDtd *)0x0) &&
       (cVar4 = *(char *)&p_Var8->_private, data = p_Var8, cVar4 != '\0')) {
      do {
        p_Var6 = data;
        if (cVar4 == ']') {
          if ((*(char *)((long)&p_Var8->_private + 1) == ']') &&
             (*(char *)((long)&p_Var8->_private + 2) == '>')) {
            p_Var6 = (_xmlDtd *)((long)&p_Var8->_private + 2);
            xmlOutputBufferWrite(buf,9,"<![CDATA[");
            xmlOutputBufferWrite(buf,(int)p_Var6 - (int)data,(char *)data);
            xmlOutputBufferWrite(buf,3,"]]>");
            p_Var8 = p_Var6;
          }
        }
        else if (cVar4 == '\0') goto LAB_0016883c;
        cVar4 = *(char *)((long)&p_Var8->_private + 1);
        p_Var8 = (_xmlDtd *)((long)&p_Var8->_private + 1);
        data = p_Var6;
      } while( true );
    }
    xmlOutputBufferWrite(buf,0xc,"<![CDATA[]]>");
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWrite(buf,1,"&");
    xmlOutputBufferWriteString(buf,cur_00->name);
    xmlOutputBufferWrite(buf,1,";");
    break;
  case XML_PI_NODE:
    if ((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    p_Var8 = cur_00->intSubset;
    xmlOutputBufferWrite(buf,2,"<?");
    xmlOutputBufferWriteString(buf,cur_00->name);
    if (p_Var8 == (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
    }
    else if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      else {
        xmlOutputBufferWrite(buf,1," ");
      }
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
    }
    xmlOutputBufferWrite(buf,2,"?>");
    break;
  case XML_COMMENT_NODE:
    if ((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) {
      xmlSaveWriteIndent(ctxt,0);
    }
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(buf,4,"<!--");
      xmlOutputBufferWriteString(buf,(char *)cur_00->intSubset);
      xmlOutputBufferWrite(buf,3,"-->");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlSaveDocInternal(ctxt,cur_00,ctxt->encoding);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    goto switchD_001684e7_caseD_b;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(buf,(xmlElementPtr)cur_00);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(buf,(xmlAttributePtr)cur_00);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(buf,(xmlEntityPtr)cur_00);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_001684e7_caseD_6:
  do {
    pxVar10 = cur_00;
    do {
      do {
        cur_00 = pxVar7;
        if (pxVar10 == (xmlDocPtr)cur) {
          return;
        }
        if ((ctxt->format == 1) && (1 < pxVar10->type - XML_XINCLUDE_START)) {
          xmlOutputBufferWrite(buf,1,"\n");
        }
        pxVar3 = (xmlDocPtr)pxVar10->next;
        if ((xmlDocPtr)pxVar10->next != (xmlDocPtr)0x0) goto LAB_001684c5;
        pxVar7 = (xmlDocPtr)cur_00->parent;
        pxVar10 = cur_00;
      } while (cur_00->type != XML_ELEMENT_NODE);
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      if (ctxt->format == 1) {
        xmlSaveWriteIndent(ctxt,0);
      }
      xmlOutputBufferWrite(buf,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar2 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar2 != (char *)0x0)) {
        xmlOutputBufferWriteString(buf,pcVar2);
        xmlOutputBufferWrite(buf,1,":");
      }
      xmlOutputBufferWriteString(buf,cur_00->name);
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(buf,1,">");
    } while (cur_00 != local_48);
    ctxt->format = iVar1;
    local_48 = (xmlDocPtr)0x0;
  } while( true );
switchD_001684e7_caseD_b:
  if (((xmlDocPtr)cur_00->parent == pxVar7) &&
     (pxVar3 = (xmlDocPtr)cur_00->children, (xmlDocPtr)cur_00->children != (xmlDocPtr)0x0))
  goto LAB_001684c5;
  goto switchD_001684e7_caseD_6;
LAB_0016883c:
  if (data != p_Var8) {
    xmlOutputBufferWrite(buf,9,"<![CDATA[");
    xmlOutputBufferWriteString(buf,(char *)data);
    xmlOutputBufferWrite(buf,3,"]]>");
  }
  goto switchD_001684e7_caseD_6;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL, parent;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;

    if (cur == NULL) return;
    buf = ctxt->buf;

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlSaveDocInternal(ctxt, (xmlDocPtr) cur, ctxt->encoding);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            /* Always validate cur->parent when descending. */
            if ((cur->parent == parent) && (cur->children != NULL)) {
                parent = cur;
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf, (xmlElementPtr) cur);
            break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf, (xmlAttributePtr) cur);
            break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf, (xmlEntityPtr) cur);
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                xmlNodeDumpOutputInternal(ctxt, cur);
                break;
            }

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    xmlOutputBufferWrite(buf, 2, "/>");
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
                    xmlOutputBufferWrite(buf, 3, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
                xmlOutputBufferWrite(buf, 1, ">");
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                parent = cur;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if (cur->name != xmlStringTextNoenc) {
                if (ctxt->escape)
                    xmlOutputBufferWriteEscape(buf, cur->content,
                                               ctxt->escape);
#ifdef TEST_OUTPUT_BUFFER_WRITE_ESCAPE
                else if (ctxt->encoding)
                    xmlOutputBufferWriteEscape(buf, cur->content, NULL);
#endif
                else
                    xmlSaveWriteText(ctxt, cur->content, /* flags */ 0);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1))
                xmlSaveWriteIndent(ctxt, 0);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if ((*end == ']') && (*(end + 1) == ']') &&
                        (*(end + 2) == '>')) {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutput(buf, (xmlNsPtr) cur, ctxt);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if (ctxt->format == 1)
                    xmlSaveWriteIndent(ctxt, 0);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
}